

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcChain.c
# Opt level: O0

Vec_Int_t * Bmc_ChainFindFailedOutputs(Gia_Man_t *p,Vec_Ptr_t *vCexes)

{
  sat_solver *s;
  int iVar1;
  int iVar2;
  Abc_Cex_t *Entry;
  bool bVar3;
  Abc_Cex_t *pCex;
  int status;
  int Lit;
  int j;
  int i;
  sat_solver *pSat;
  Gia_Obj_t *pObj;
  Gia_Man_t *pInit;
  Vec_Int_t *vSatIds;
  Vec_Int_t *vOutputs;
  Vec_Ptr_t *vCexes_local;
  Gia_Man_t *p_local;
  
  pCex._0_4_ = 0;
  vOutputs = (Vec_Int_t *)vCexes;
  vCexes_local = (Vec_Ptr_t *)p;
  pObj = (Gia_Obj_t *)Gia_ManDupPosAndPropagateInit(p);
  iVar1 = Gia_ManPiNum((Gia_Man_t *)vCexes_local);
  pInit = (Gia_Man_t *)Vec_IntAlloc(iVar1);
  _j = Gia_ManDeriveSatSolver((Gia_Man_t *)pObj,(Vec_Int_t *)pInit);
  vSatIds = Vec_IntAlloc(100);
  Lit = 0;
  while( true ) {
    iVar1 = Lit;
    iVar2 = Gia_ManPoNum((Gia_Man_t *)pObj);
    bVar3 = false;
    if (iVar1 < iVar2) {
      pSat = (sat_solver *)Gia_ManCo((Gia_Man_t *)pObj,Lit);
      bVar3 = pSat != (sat_solver *)0x0;
    }
    if (!bVar3) break;
    iVar1 = Gia_ObjFaninLit0p((Gia_Man_t *)pObj,(Gia_Obj_t *)pSat);
    if (iVar1 != 0) {
      pCex._4_4_ = Abc_Var2Lit(Lit + 1,0);
      pCex._0_4_ = sat_solver_solve(_j,(lit *)((long)&pCex + 4),&status,0,0,0,0);
      if (((int)pCex == 1) && (Vec_IntPush(vSatIds,Lit), vOutputs != (Vec_Int_t *)0x0)) {
        iVar1 = Gia_ManRegNum((Gia_Man_t *)vCexes_local);
        iVar2 = Gia_ManPiNum((Gia_Man_t *)vCexes_local);
        Entry = Abc_CexAlloc(iVar1,iVar2,1);
        Entry->iFrame = 0;
        Entry->iPo = Lit;
        for (status = 0; iVar1 = status, iVar2 = Gia_ManPiNum((Gia_Man_t *)vCexes_local), s = _j,
            iVar1 < iVar2; status = status + 1) {
          iVar1 = Vec_IntEntry((Vec_Int_t *)pInit,status);
          iVar1 = sat_solver_var_value(s,iVar1);
          if (iVar1 != 0) {
            iVar1 = Gia_ManRegNum((Gia_Man_t *)vCexes_local);
            Abc_InfoSetBit((uint *)(Entry + 1),iVar1 + status);
          }
        }
        Vec_PtrPush((Vec_Ptr_t *)vOutputs,Entry);
      }
    }
    Lit = Lit + 1;
  }
  Gia_ManStop((Gia_Man_t *)pObj);
  sat_solver_delete(_j);
  Vec_IntFree((Vec_Int_t *)pInit);
  return vSatIds;
}

Assistant:

Vec_Int_t * Bmc_ChainFindFailedOutputs( Gia_Man_t * p, Vec_Ptr_t * vCexes )
{
    Vec_Int_t * vOutputs;
    Vec_Int_t * vSatIds;
    Gia_Man_t * pInit;
    Gia_Obj_t * pObj;
    sat_solver * pSat;
    int i, j, Lit, status = 0;
    // derive output logic cones
    pInit = Gia_ManDupPosAndPropagateInit( p );
    // derive SAT solver and test
    vSatIds = Vec_IntAlloc( Gia_ManPiNum(p) );
    pSat = Gia_ManDeriveSatSolver( pInit, vSatIds );
    vOutputs = Vec_IntAlloc( 100 );
    Gia_ManForEachPo( pInit, pObj, i )
    {
        if ( Gia_ObjFaninLit0p(pInit, pObj) == 0 )
            continue;
        Lit = Abc_Var2Lit( i+1, 0 );
        status = sat_solver_solve( pSat, &Lit, &Lit + 1, 0, 0, 0, 0 );
        if ( status == l_True )
        {
            // save the index of solved output
            Vec_IntPush( vOutputs, i );
            // create CEX for this output
            if ( vCexes )
            {
                Abc_Cex_t * pCex = Abc_CexAlloc( Gia_ManRegNum(p), Gia_ManPiNum(p), 1 );
                pCex->iFrame = 0;
                pCex->iPo = i;
                for ( j = 0; j < Gia_ManPiNum(p); j++ )
                    if ( sat_solver_var_value( pSat, Vec_IntEntry(vSatIds, j) ) )
                        Abc_InfoSetBit( pCex->pData, Gia_ManRegNum(p) + j );
                Vec_PtrPush( vCexes, pCex );
            }
        }
    }
    Gia_ManStop( pInit );
    sat_solver_delete( pSat );
    Vec_IntFree( vSatIds );
    return vOutputs;
}